

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

bool __thiscall Pathie::Path::is_file(Path *this)

{
  int iVar1;
  int *piVar2;
  ErrnoError *this_00;
  bool bVar3;
  string nstr;
  stat s;
  
  utf8_to_filename(&nstr,&this->m_path);
  iVar1 = ::stat(nstr._M_dataplus._M_p,(stat *)&s);
  if (iVar1 < 0) {
    piVar2 = __errno_location();
    iVar1 = *piVar2;
    if (iVar1 != 2) {
      this_00 = (ErrnoError *)__cxa_allocate_exception(0x30);
      ErrnoError::ErrnoError(this_00,iVar1);
      __cxa_throw(this_00,&ErrnoError::typeinfo,GlobError::~GlobError);
    }
    bVar3 = false;
  }
  else {
    bVar3 = (s.st_mode & 0xf000) == 0x8000;
  }
  std::__cxx11::string::_M_dispose();
  return bVar3;
}

Assistant:

bool Path::is_file() const
{
#if defined(_PATHIE_UNIX)
  struct stat s;
  std::string nstr = native();

  if (::stat(nstr.c_str(), &s) < 0) {
    int errsav = errno;

    if (errsav == ENOENT)
      return false;
    else
      throw(Pathie::ErrnoError(errsav));
  }

  if (S_ISREG(s.st_mode))
    return true;
  else
    return false;
#elif defined(_WIN32)
  struct _stat s;
  std::wstring utf16 = utf8_to_utf16(m_path);
  if (_wstat(utf16.c_str(), &s) < 0) {
    int errsav = errno;

    if (errsav == ENOENT)
      return false;
    else
      throw(Pathie::ErrnoError(errno));
  }

  return s.st_mode & S_IFREG;
#else
#error Unsupported system.
#endif
}